

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS
ref_smooth_tri_ratio_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_ratio,REF_DBL *max_ratio)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  REF_DBL RVar10;
  REF_DBL ratio;
  ulong local_b0;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  uVar8 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar8 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar8 = (ulong)uVar4;
      }
    }
  }
  ref_node = ref_grid->node;
  bVar3 = true;
  while( true ) {
    if ((int)uVar8 == -1) {
      if (bVar3) {
        *min_ratio = 2000.0;
        *max_ratio = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x9a,"ref_smooth_tri_ratio_around","no triangle found, can not compute ratio");
      }
      return (uint)bVar3;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    local_b0 = uVar8;
    for (lVar7 = 0; lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
      if (nodes[lVar7] != node) {
        uVar4 = ref_node_ratio(ref_node,node,nodes[lVar7],&ratio);
        if (uVar4 != 0) {
          pcVar6 = "ratio";
          uVar5 = 0x8a;
          goto LAB_001df9ff;
        }
        if (bVar3) {
          *min_ratio = ratio;
          RVar10 = ratio;
        }
        else {
          dVar9 = *min_ratio;
          if (ratio <= *min_ratio) {
            dVar9 = ratio;
          }
          *min_ratio = dVar9;
          RVar10 = *max_ratio;
          if (*max_ratio <= ratio) {
            RVar10 = ratio;
          }
        }
        *max_ratio = RVar10;
        bVar3 = false;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar8 = (ulong)pRVar2[(int)local_b0].next;
    cell = -1;
    if (uVar8 != 0xffffffffffffffff) {
      cell = pRVar2[uVar8].ref;
    }
  }
  pcVar6 = "nodes";
  uVar5 = 0x87;
LAB_001df9ff:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tri_ratio_around",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ratio_around(REF_GRID ref_grid, REF_INT node,
                                               REF_DBL *min_ratio,
                                               REF_DBL *max_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL ratio;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node != nodes[cell_node]) {
        RSS(ref_node_ratio(ref_node, node, nodes[cell_node], &ratio), "ratio");
        if (none_found) {
          none_found = REF_FALSE;
          *min_ratio = ratio;
          *max_ratio = ratio;
        } else {
          *min_ratio = MIN(*min_ratio, ratio);
          *max_ratio = MAX(*max_ratio, ratio);
        }
      }
    }
  }

  if (none_found) {
    *min_ratio = 2000.0;
    *max_ratio = -2.0;
    THROW("no triangle found, can not compute ratio");
  }

  return REF_SUCCESS;
}